

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
calculator::NegateTypeException::NegateTypeException(NegateTypeException *this,double x)

{
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  double local_18;
  double x_local;
  NegateTypeException *this_local;
  
  local_18 = x;
  x_local = (double)this;
  ValueException::ValueException(&this->super_ValueException);
  *(undefined ***)&(this->super_ValueException).super_SyntaxError =
       &PTR__NegateTypeException_00136850;
  std::__cxx11::to_string(&local_58,local_18);
  std::operator+(&local_38,"Error: can not negate double/float type: ",&local_58);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ValueException).super_SyntaxError.error_msg,(string *)&local_38
            );
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

NegateTypeException(double x) {
        error_msg =
            "Error: can not negate double/float type: " + std::to_string(x);
    }